

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

void __thiscall Dice::addDiceValuesToResolvedHand(Dice *this)

{
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  int iVar1;
  mapped_type *pmVar2;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_01;
  undefined8 local_38;
  
  this_00 = &this->DiceValues;
  local_38._4_4_ = 1;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&local_38 + 4));
  iVar1 = *pmVar2;
  this_01 = &this->resolvedHand;
  local_38 = CONCAT44(local_38._4_4_,1);
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_01,(key_type *)&local_38);
  *pmVar2 = *pmVar2 + iVar1;
  local_38._4_4_ = 3;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&local_38 + 4));
  iVar1 = *pmVar2;
  local_38 = CONCAT44(local_38._4_4_,3);
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_01,(key_type *)&local_38);
  *pmVar2 = *pmVar2 + iVar1;
  local_38 = local_38 & 0xffffffff;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&local_38 + 4));
  iVar1 = *pmVar2;
  local_38 = local_38 & 0xffffffff00000000;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_01,(key_type *)&local_38);
  *pmVar2 = *pmVar2 + iVar1;
  local_38._4_4_ = 5;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&local_38 + 4));
  iVar1 = *pmVar2;
  local_38 = CONCAT44(local_38._4_4_,5);
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_01,(key_type *)&local_38);
  *pmVar2 = *pmVar2 + iVar1;
  local_38._4_4_ = 2;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&local_38 + 4));
  iVar1 = *pmVar2;
  local_38 = CONCAT44(local_38._4_4_,2);
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_01,(key_type *)&local_38);
  *pmVar2 = *pmVar2 + iVar1;
  local_38._4_4_ = 4;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&local_38 + 4));
  iVar1 = *pmVar2;
  local_38 = CONCAT44(local_38._4_4_,4);
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_01,(key_type *)&local_38);
  *pmVar2 = *pmVar2 + iVar1;
  return;
}

Assistant:

void Dice::addDiceValuesToResolvedHand() {
    resolvedHand[DiceOptions::Attack] += DiceValues[DiceOptions::Attack];
    resolvedHand[DiceOptions::Heal] += DiceValues[DiceOptions::Heal];
    resolvedHand[DiceOptions::Energy] += DiceValues[DiceOptions::Energy];
    resolvedHand[DiceOptions::Ouch] += DiceValues[DiceOptions::Ouch];
    resolvedHand[DiceOptions::Destruction] += DiceValues[DiceOptions::Destruction];
    resolvedHand[DiceOptions::Celebrity] += DiceValues[DiceOptions::Celebrity];

}